

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O3

ErrorCode __thiscall ComponentManager::RemoveModule(ComponentManager *this,char *name)

{
  ErrorCode EVar1;
  ModuleInfo *pMVar2;
  
  pMVar2 = getModInfo(this,name);
  EVar1 = kNoClass;
  if ((pMVar2 != (ModuleInfo *)0x0) && (pMVar2->mModule != (IModule *)0x0)) {
    (**(code **)(*(long *)pMVar2->mModule + 0x38))();
    (**(code **)(*(long *)pMVar2->mModule + 8))();
    pMVar2->mModule = (IModule *)0x0;
    EVar1 = kNoError;
  }
  return EVar1;
}

Assistant:

ErrorCode ComponentManager::RemoveModule( const char *name )
{
	ModuleInfo *info = getModInfo( name );

	if ( info == NULL || info->mModule == NULL )
		return kNoClass;	

	info->mModule->unloadComponents();
	info->mModule->Release();
	info->mModule = NULL;
	
	return kNoError;
}